

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O0

void __thiscall KDReports::Test::testSpreadSheetMode(Test *this)

{
  byte bVar1;
  bool bVar2;
  QStandardItem *pQVar3;
  QAbstractItemModel *t1;
  Orientation local_e0;
  Orientation local_dc;
  QStandardItemModel *local_d8;
  QAbstractItemModel *baseModel;
  QString local_c8;
  QFile local_b0 [8];
  QFile file;
  QString local_a0;
  undefined1 local_81;
  QString local_80;
  undefined1 local_61;
  QString local_60;
  QStandardItemModel local_48 [8];
  QStandardItemModel model;
  Report local_28 [8];
  Report report;
  Test *this_local;
  
  KDReports::Report::Report(local_28,(QObject *)0x0);
  KDReports::Report::setReportMode((ReportMode)local_28);
  QStandardItemModel::QStandardItemModel(local_48,(QObject *)0x0);
  pQVar3 = (QStandardItem *)operator_new(0x10);
  local_61 = 1;
  QString::QString(&local_60,"cell1");
  QStandardItem::QStandardItem(pQVar3,(QString *)&local_60);
  local_61 = 0;
  QStandardItemModel::setItem((int)local_48,0,(QStandardItem *)0x0);
  QString::~QString(&local_60);
  pQVar3 = (QStandardItem *)operator_new(0x10);
  local_81 = 1;
  QString::QString(&local_80,"cell2");
  QStandardItem::QStandardItem(pQVar3,(QString *)&local_80);
  local_81 = 0;
  QStandardItemModel::setItem((int)local_48,0,(QStandardItem *)0x1);
  QString::~QString(&local_80);
  QString::QString(&local_a0,"table1");
  KDReports::Report::associateModel((QString *)local_28,(QAbstractItemModel *)&local_a0);
  QString::~QString(&local_a0);
  QString::QString(&local_c8,":/spreadsheet.xml");
  QFile::QFile(local_b0,(QString *)&local_c8);
  QString::~QString(&local_c8);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)((long)&baseModel + 4),ReadOnly);
  bVar1 = QFile::open((QFlags_conflict *)local_b0);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x14e);
  if ((bVar1 & 1) == 0) {
    baseModel._0_4_ = 1;
  }
  else {
    bVar1 = KDReports::Report::loadFromXML((QIODevice *)local_28,(ErrorDetails *)local_b0);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x14f);
    if ((bVar1 & 1) == 0) {
      baseModel._0_4_ = 1;
    }
    else {
      local_d8 = local_48;
      KDReports::Report::mainTable();
      KDReports::MainTable::autoTableElement();
      t1 = (QAbstractItemModel *)KDReports::AutoTableElement::tableModel();
      bVar2 = QTest::qCompare<QAbstractItemModel>
                        (t1,(QAbstractItemModel *)local_d8,
                         "report.mainTable()->autoTableElement()->tableModel()","baseModel",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0x152);
      if (bVar2) {
        local_dc = KDReports::Report::pageOrientation();
        local_e0 = Landscape;
        bVar2 = QTest::qCompare<QPageLayout::Orientation,QPageLayout::Orientation>
                          (&local_dc,&local_e0,"report.pageOrientation()","QPageLayout::Landscape",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x153);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          baseModel._0_4_ = 0;
        }
        else {
          baseModel._0_4_ = 1;
        }
      }
      else {
        baseModel._0_4_ = 1;
      }
    }
  }
  QFile::~QFile(local_b0);
  QStandardItemModel::~QStandardItemModel(local_48);
  KDReports::Report::~Report(local_28);
  return;
}

Assistant:

void testSpreadSheetMode()
    {
        Report report;
        // TODO: make this part of the XML?
        report.setReportMode(Report::SpreadSheet);

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("cell1"));
        model.setItem(0, 1, new QStandardItem("cell2"));
        report.associateModel("table1", &model);

        QFile file(":/spreadsheet.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        QVERIFY(report.loadFromXML(&file));

        QAbstractItemModel *baseModel = &model;
        QCOMPARE(report.mainTable()->autoTableElement()->tableModel(), baseModel);
        QCOMPARE(report.pageOrientation(), QPageLayout::Landscape);
    }